

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_argerror(lua_State *L,int arg,char *extramsg)

{
  int iVar1;
  ulong uVar2;
  lua_Debug ar;
  
  uVar2 = (ulong)(uint)arg;
  iVar1 = lua_getstack(L,0,&ar);
  if (iVar1 == 0) {
    iVar1 = luaL_error(L,"bad argument #%d (%s)",uVar2,extramsg);
  }
  else {
    lua_getinfo(L,"n",&ar);
    iVar1 = strcmp(ar.namewhat,"method");
    if ((iVar1 == 0) && (uVar2 = (ulong)(arg - 1U), arg - 1U == 0)) {
      iVar1 = luaL_error(L,"calling \'%s\' on bad self (%s)",ar.name,extramsg);
    }
    else {
      if (ar.name == (char *)0x0) {
        iVar1 = pushglobalfuncname(L,&ar);
        if (iVar1 == 0) {
          ar.name = "?";
        }
        else {
          ar.name = lua_tolstring(L,-1,(size_t *)0x0);
        }
      }
      iVar1 = luaL_error(L,"bad argument #%d to \'%s\' (%s)",uVar2,ar.name,extramsg);
    }
  }
  return iVar1;
}

Assistant:

LUALIB_API int luaL_argerror (lua_State *L, int arg, const char *extramsg) {
  lua_Debug ar;
  if (!lua_getstack(L, 0, &ar))  /* no stack frame? */
    return luaL_error(L, "bad argument #%d (%s)", arg, extramsg);
  lua_getinfo(L, "n", &ar);
  if (strcmp(ar.namewhat, "method") == 0) {
    arg--;  /* do not count 'self' */
    if (arg == 0)  /* error is in the self argument itself? */
      return luaL_error(L, "calling '%s' on bad self (%s)",
                           ar.name, extramsg);
  }
  if (ar.name == NULL)
    ar.name = (pushglobalfuncname(L, &ar)) ? lua_tostring(L, -1) : "?";
  return luaL_error(L, "bad argument #%d to '%s' (%s)",
                        arg, ar.name, extramsg);
}